

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

pointer __thiscall
Eigen::aligned_allocator<ear::conversion::Sector>::allocate
          (aligned_allocator<ear::conversion::Sector> *this,size_type num,void *param_2)

{
  pointer pSVar1;
  
  if (0x2aaaaaaaaaaaaaa < num) {
    internal::throw_std_bad_alloc();
  }
  pSVar1 = (pointer)internal::aligned_malloc(num * 0x60);
  return pSVar1;
}

Assistant:

pointer allocate(size_type num, const void* /*hint*/ = 0)
  {
    internal::check_size_for_overflow<T>(num);
    return static_cast<pointer>( internal::aligned_malloc(num * sizeof(T)) );
  }